

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

tuple<unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* getSearchOptions_abi_cxx11_
            (tuple<unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,int argc,char **argv,int startarg,bool istty)

{
  _Tuple_impl<2ul,std::__cxx11::string,std::__cxx11::string> *p_Var1;
  char *opts;
  long lVar2;
  undefined7 in_register_00000081;
  uint options;
  uint limit;
  string exclude;
  string include;
  uint local_80;
  uint local_7c;
  _Tuple_impl<2ul,std::__cxx11::string,std::__cxx11::string> *local_78;
  string local_70;
  string local_50;
  
  local_80 = (int)CONCAT71(in_register_00000081,istty) << 10;
  local_7c = 0xffffffff;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  opts = getenv("QGREP_OPTIONS");
  if (opts != (char *)0x0) {
    parseSearchOptions(opts,&local_80,&local_7c,&local_50,&local_70);
  }
  lVar2 = (long)startarg;
  local_78 = (_Tuple_impl<2ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__;
  while (p_Var1 = local_78, lVar2 + 1 < (long)argc) {
    parseSearchOptions(argv[lVar2],&local_80,&local_7c,&local_50,&local_70);
    lVar2 = lVar2 + 1;
  }
  if ((local_80 & 0x78) == 0) {
    local_80 = local_80 | 0x10;
  }
  if ((local_80 >> 10 & 1) != 0) {
    local_80 = local_80 | 0x800;
  }
  local_7c = -(uint)(local_7c == 0) | local_7c;
  std::_Tuple_impl<2ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>(local_78,&local_50,&local_70);
  *(uint *)(p_Var1 + 0x40) = local_7c;
  *(uint *)(p_Var1 + 0x44) = local_80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (tuple<unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var1;
}

Assistant:

std::tuple<unsigned int, unsigned int, std::string, std::string> getSearchOptions(int argc, const char** argv, int startarg, bool istty)
{
	unsigned int options = istty ? SO_HIGHLIGHT : 0;
	unsigned int limit = ~0u;
	std::string include, exclude;

	const char* gopts = getenv("QGREP_OPTIONS");

	// parse global options
	if (gopts)
		parseSearchOptions(gopts, options, limit, include, exclude);

	// parse command-line options
	for (int i = startarg; i + 1 < argc; ++i)
		parseSearchOptions(argv[i], options, limit, include, exclude);

	// choose default file search type
	if ((options & (SO_FILE_NAMEREGEX | SO_FILE_PATHREGEX | SO_FILE_VISUALASSIST | SO_FILE_FUZZY)) == 0)
		options |= SO_FILE_PATHREGEX;

	// highlighting includes match highlighting
	if (options & SO_HIGHLIGHT)
		options |= SO_HIGHLIGHT_MATCHES;

	// L0 means "no limit"
	if (limit == 0)
		limit = ~0u;

	return std::make_tuple(options, limit, include, exclude);
}